

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufchain.c
# Opt level: O2

void bufchain_add(bufchain *ch,void *data,size_t len)

{
  char **ppcVar1;
  char *__dest;
  bufchain_granule *pbVar2;
  bufchain *pbVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (len != 0) {
    ch->buffersize = ch->buffersize + len;
    while (uVar4 = len, uVar4 != 0) {
      pbVar2 = ch->tail;
      if (pbVar2 == (bufchain_granule *)0x0) goto LAB_00121fa9;
      __dest = pbVar2->bufend;
      if (pbVar2->bufmax <= __dest) goto LAB_00121fa9;
      uVar5 = (long)pbVar2->bufmax - (long)__dest;
      if (uVar4 < uVar5) {
        uVar5 = uVar4;
      }
      memcpy(__dest,data,uVar5);
      ppcVar1 = &ch->tail->bufend;
      *ppcVar1 = *ppcVar1 + uVar5;
      data = (void *)((long)data + uVar5);
      uVar4 = uVar4 - uVar5;
      len = 0;
      if (uVar4 != 0) {
LAB_00121fa9:
        uVar5 = uVar4 + 0x20;
        if (uVar5 < 0x201) {
          uVar5 = 0x200;
        }
        pbVar2 = (bufchain_granule *)safemalloc(uVar5,1,0);
        pbVar2->bufend = (char *)(pbVar2 + 1);
        pbVar2->bufpos = (char *)(pbVar2 + 1);
        pbVar2->bufmax = (char *)((long)&pbVar2->next + uVar5);
        pbVar2->next = (bufchain_granule *)0x0;
        pbVar3 = (bufchain *)ch->tail;
        if ((bufchain *)ch->tail == (bufchain *)0x0) {
          pbVar3 = ch;
        }
        pbVar3->head = pbVar2;
        ch->tail = pbVar2;
        len = uVar4;
      }
    }
    if (ch->ic != (IdempotentCallback *)0x0) {
      (*ch->queue_idempotent_callback)(ch->ic);
      return;
    }
  }
  return;
}

Assistant:

void bufchain_add(bufchain *ch, const void *data, size_t len)
{
    const char *buf = (const char *)data;

    if (len == 0) return;

    ch->buffersize += len;

    while (len > 0) {
        if (ch->tail && ch->tail->bufend < ch->tail->bufmax) {
            size_t copylen = min(len, ch->tail->bufmax - ch->tail->bufend);
            memcpy(ch->tail->bufend, buf, copylen);
            buf += copylen;
            len -= copylen;
            ch->tail->bufend += copylen;
        }
        if (len > 0) {
            size_t grainlen =
                max(sizeof(struct bufchain_granule) + len, BUFFER_MIN_GRANULE);
            struct bufchain_granule *newbuf;
            newbuf = smalloc(grainlen);
            newbuf->bufpos = newbuf->bufend =
                (char *)newbuf + sizeof(struct bufchain_granule);
            newbuf->bufmax = (char *)newbuf + grainlen;
            newbuf->next = NULL;
            if (ch->tail)
                ch->tail->next = newbuf;
            else
                ch->head = newbuf;
            ch->tail = newbuf;
        }
    }

    if (ch->ic)
        ch->queue_idempotent_callback(ch->ic);
}